

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O2

vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> * __thiscall
tandem::detail::extract_exact_tandem_repeats_lz<std::__cxx11::string>
          (vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *__return_storage_ptr__,
          detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          uint32_t min_period,uint32_t max_period)

{
  pointer pRVar1;
  unsigned_long __n;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *bucket;
  pointer this_00;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  sorted_buckets;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  local_30;
  
  extract_maximal_repetitions<std::__cxx11::string>(&local_30,this,str,min_period,max_period);
  (__return_storage_ptr__->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = count_runs<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>(&local_30);
  std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::reserve(__return_storage_ptr__,__n);
  for (this_00 = local_30.
                 super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      local_30.
      super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>::
    insert<__gnu_cxx::__normal_iterator<tandem::Repeat_const*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>,void>
              ((vector<tandem::Repeat,std::allocator<tandem::Repeat>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    pRVar1 = (this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pRVar1) {
      (this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
      super__Vector_impl_data._M_finish = pRVar1;
    }
    std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::_M_shrink_to_fit(this_00);
  }
  std::
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Repeat>
extract_exact_tandem_repeats_lz(const T& str, const std::uint32_t min_period, const std::uint32_t max_period)
{
    auto sorted_buckets = detail::extract_maximal_repetitions(str, min_period, max_period);
    std::vector<Repeat> result {};
    result.reserve(detail::count_runs(sorted_buckets));
    for (auto& bucket : sorted_buckets) {
        result.insert(std::end(result), std::cbegin(bucket), std::cend(bucket));
        bucket.clear();
        bucket.shrink_to_fit();
    }
    return result;
}